

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covInt.h
# Opt level: O0

void Min_CoverExpandRemoveEqual(Min_Man_t *p,Min_Cube_t *pCover)

{
  int iVar1;
  Min_Cube_t *local_40;
  Min_Cube_t *local_38;
  Min_Cube_t *local_30;
  Min_Cube_t *pThis;
  Min_Cube_t *pCube2;
  Min_Cube_t *pCube;
  Min_Cube_t *pCover_local;
  Min_Man_t *p_local;
  
  if (pCover == (Min_Cube_t *)0x0) {
    Min_ManClean(p,p->nVars);
  }
  else {
    Min_ManClean(p,*(uint *)&pCover->field_0x8 & 0x3ff);
    if (pCover == (Min_Cube_t *)0x0) {
      local_38 = (Min_Cube_t *)0x0;
    }
    else {
      local_38 = pCover->pNext;
    }
    pThis = local_38;
    pCube2 = pCover;
    while (pCube2 != (Min_Cube_t *)0x0) {
      for (local_30 = p->ppStore[*(uint *)&pCube2->field_0x8 >> 0x16]; local_30 != (Min_Cube_t *)0x0
          ; local_30 = local_30->pNext) {
        iVar1 = Min_CubesAreEqual(pCube2,local_30);
        if (iVar1 != 0) {
          Min_CubeRecycle(p,pCube2);
          break;
        }
      }
      if (local_30 == (Min_Cube_t *)0x0) {
        pCube2->pNext = p->ppStore[*(uint *)&pCube2->field_0x8 >> 0x16];
        p->ppStore[*(uint *)&pCube2->field_0x8 >> 0x16] = pCube2;
        p->nCubes = p->nCubes + 1;
      }
      pCube2 = pThis;
      if (pThis == (Min_Cube_t *)0x0) {
        local_40 = (Min_Cube_t *)0x0;
      }
      else {
        local_40 = pThis->pNext;
      }
      pThis = local_40;
    }
  }
  return;
}

Assistant:

static inline void Min_CoverExpandRemoveEqual( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube, * pCube2, * pThis;
    if ( pCover == NULL )
    {
        Min_ManClean( p, p->nVars );
        return;
    }
    Min_ManClean( p, pCover->nVars );
    Min_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        // go through the linked list
        Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
            if ( Min_CubesAreEqual( pCube, pThis ) )
            {
                Min_CubeRecycle( p, pCube );
                break;
            }
        if ( pThis != NULL )
            continue;
        pCube->pNext = p->ppStore[pCube->nLits];
        p->ppStore[pCube->nLits] = pCube;
        p->nCubes++;
    }
}